

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_CHECKMULTISIG23::test_method(script_CHECKMULTISIG23 *this)

{
  long lVar1;
  bool bVar2;
  CScript *pCVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  check_type cVar6;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  assertion_result local_680;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  vector<CKey,_std::allocator<CKey>_> keys;
  CKey key4;
  CKey key3;
  CKey key2;
  CKey key1;
  ScriptError err;
  undefined1 local_2e8 [16];
  shared_count asStack_2d8 [2];
  CScript badsig6;
  CScript badsig5;
  CScript badsig4;
  CScript badsig3;
  CScript badsig2;
  CScript badsig1;
  CScript goodsig3;
  CScript goodsig2;
  undefined1 local_1c8 [24];
  pointer pCStack_1b0;
  pointer local_1a8;
  CScript goodsig1;
  CTransaction txFrom23;
  CMutableTransaction txTo23;
  CScript scriptPubKey23;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(false);
  GenerateRandomKey(SUB81(&key2,0));
  GenerateRandomKey(SUB81(&key3,0));
  GenerateRandomKey(SUB81(&key4,0));
  scriptPubKey23.super_CScriptBase._union._16_8_ = 0;
  scriptPubKey23.super_CScriptBase._24_8_ = 0;
  scriptPubKey23.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptPubKey23.super_CScriptBase._union._8_8_ = 0;
  pCVar3 = CScript::operator<<(&scriptPubKey23,OP_2);
  CKey::GetPubKey((CPubKey *)&txFrom23,&key1);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig1,(CPubKey *)&txFrom23
            );
  b._M_extent._M_extent_value =
       goodsig1.super_CScriptBase._union._8_8_ - goodsig1.super_CScriptBase._union._0_8_;
  b._M_ptr = (pointer)goodsig1.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b);
  CKey::GetPubKey((CPubKey *)local_1c8,&key2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig2,(CPubKey *)local_1c8
            );
  b_00._M_extent._M_extent_value =
       CONCAT71(goodsig2.super_CScriptBase._union._9_7_,goodsig2.super_CScriptBase._union.direct[8])
       - goodsig2.super_CScriptBase._union._0_8_;
  b_00._M_ptr = (pointer)goodsig2.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b_00);
  CKey::GetPubKey((CPubKey *)&txTo23,&key3);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig3,(CPubKey *)&txTo23);
  b_01._M_extent._M_extent_value =
       goodsig3.super_CScriptBase._union._8_8_ - goodsig3.super_CScriptBase._union._0_8_;
  b_01._M_ptr = (pointer)goodsig3.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b_01);
  pCVar3 = CScript::operator<<(pCVar3,OP_3);
  CScript::operator<<(pCVar3,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&goodsig1);
  BuildCreditingTransaction((CMutableTransaction *)local_1c8,&scriptPubKey23,0);
  CTransaction::CTransaction(&txFrom23,(CMutableTransaction *)local_1c8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)local_1c8);
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  goodsig1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  goodsig1.super_CScriptBase._union._8_8_ = 0;
  goodsig1.super_CScriptBase._union._16_8_ = 0;
  BuildSpendingTransaction(&txTo23,(CScript *)local_1c8,(CScriptWitness *)&goodsig1,&txFrom23);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&goodsig1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key1);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&goodsig1,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x43a;
  file.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&goodsig1,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  goodsig3.super_CScriptBase._union.direct[0] = bVar2;
  goodsig3.super_CScriptBase._union._8_8_ = 0;
  goodsig3.super_CScriptBase._union._16_8_ = 0;
  goodsig2.super_CScriptBase._24_8_ = &badsig1;
  badsig1.super_CScriptBase._union.indirect_contents.indirect =
       "VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig1.super_CScriptBase._union._8_8_ =
       (long)
       "VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  goodsig2.super_CScriptBase._union.direct[8] = '\0';
  goodsig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  goodsig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_370 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&goodsig3,(lazy_ostream *)&goodsig2,1,0,WARN,_cVar6,
             (size_t)&local_378,0x43a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&goodsig3.super_CScriptBase._union + 0x10));
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x43b;
  file_00.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_398,
             msg_00);
  goodsig3.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_OK;
  goodsig3.super_CScriptBase._union._8_8_ = 0;
  goodsig3.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&goodsig2,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&goodsig2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&goodsig3,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_3a8,0x43b);
  std::__cxx11::string::~string((string *)&goodsig2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&goodsig3.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key1);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key3);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&goodsig2,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x440;
  file_01.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c8,
             msg_01);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&goodsig2,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig1.super_CScriptBase._union.direct[0] = bVar2;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  goodsig3.super_CScriptBase._24_8_ = &badsig2;
  badsig2.super_CScriptBase._union.indirect_contents.indirect =
       "VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig2.super_CScriptBase._union._8_8_ =
       (long)
       "VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  goodsig3.super_CScriptBase._union._8_8_ =
       goodsig3.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  goodsig3.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  goodsig3.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)&goodsig3,1,0,WARN,_cVar6,
             (size_t)&local_3d8,0x440);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x441;
  file_02.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f8,
             msg_02);
  badsig1.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_OK;
  badsig1.super_CScriptBase._union._8_8_ = 0;
  badsig1.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&goodsig3,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_400 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&goodsig3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig1,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_408,0x441);
  std::__cxx11::string::~string((string *)&goodsig3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig1.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key3);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&goodsig3,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x446;
  file_03.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_428,
             msg_03);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&goodsig3,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig2.super_CScriptBase._union.direct[0] = bVar2;
  badsig2.super_CScriptBase._union._8_8_ = 0;
  badsig2.super_CScriptBase._union._16_8_ = 0;
  badsig1.super_CScriptBase._24_8_ = &badsig3;
  badsig3.super_CScriptBase._union.indirect_contents.indirect =
       "VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig3.super_CScriptBase._union._8_8_ =
       (long)
       "VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  badsig1.super_CScriptBase._union._8_8_ =
       badsig1.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig1.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig1.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_430 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig2,(lazy_ostream *)&badsig1,1,0,WARN,_cVar6,
             (size_t)&local_438,0x446);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig2.super_CScriptBase._union + 0x10));
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x447;
  file_04.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_458,
             msg_04);
  badsig2.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_OK;
  badsig2.super_CScriptBase._union._8_8_ = 0;
  badsig2.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&badsig1,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_460 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig2,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_468,0x447);
  std::__cxx11::string::~string((string *)&badsig1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig2.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig1,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x44c;
  file_05.m_begin = (iterator)&local_478;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_488,
             msg_05);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig1,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig3.super_CScriptBase._union.direct[0] = !bVar2;
  badsig3.super_CScriptBase._union._8_8_ = 0;
  badsig3.super_CScriptBase._union._16_8_ = 0;
  badsig2.super_CScriptBase._24_8_ = &badsig4;
  badsig4.super_CScriptBase._union.indirect_contents.indirect =
       "!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig4.super_CScriptBase._union._8_8_ =
       (long)
       "!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  badsig2.super_CScriptBase._union._8_8_ =
       badsig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_490 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig3,(lazy_ostream *)&badsig2,1,0,WARN,_cVar6,
             (size_t)&local_498,0x44c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig3.super_CScriptBase._union + 0x10));
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x44d;
  file_06.m_begin = (iterator)&local_4a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4b8,
             msg_06);
  badsig3.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_EVAL_FALSE;
  badsig3.super_CScriptBase._union._8_8_ = 0;
  badsig3.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&badsig2,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4c0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig3,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_4c8,0x44d);
  std::__cxx11::string::~string((string *)&badsig2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig3.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key1);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig2,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x452;
  file_07.m_begin = (iterator)&local_4d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4e8,
             msg_07);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig2,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig4.super_CScriptBase._union.direct[0] = !bVar2;
  badsig4.super_CScriptBase._union._8_8_ = 0;
  badsig4.super_CScriptBase._union._16_8_ = 0;
  badsig3.super_CScriptBase._24_8_ = &badsig5;
  badsig5.super_CScriptBase._union.indirect_contents.indirect =
       "!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig5.super_CScriptBase._union._8_8_ =
       (long)
       "!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  badsig3.super_CScriptBase._union._8_8_ =
       badsig3.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig3.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig3.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4f0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig4,(lazy_ostream *)&badsig3,1,0,WARN,_cVar6,
             (size_t)&local_4f8,0x452);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig4.super_CScriptBase._union + 0x10));
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x453;
  file_08.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_518,
             msg_08);
  badsig4.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_EVAL_FALSE;
  badsig4.super_CScriptBase._union._8_8_ = 0;
  badsig4.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&badsig3,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_520 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig4,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_528,0x453);
  std::__cxx11::string::~string((string *)&badsig3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig4.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key3);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig3,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x458;
  file_09.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_548,
             msg_09);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig3,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig5.super_CScriptBase._union.direct[0] = !bVar2;
  badsig5.super_CScriptBase._union._8_8_ = 0;
  badsig5.super_CScriptBase._union._16_8_ = 0;
  badsig4.super_CScriptBase._24_8_ = &badsig6;
  badsig6.super_CScriptBase._union.indirect_contents.indirect =
       "!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  badsig6.super_CScriptBase._union._8_8_ =
       (long)
       "!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
       + 0xa8;
  badsig4.super_CScriptBase._union._8_8_ =
       badsig4.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig4.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig4.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_550 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig5,(lazy_ostream *)&badsig4,1,0,WARN,_cVar6,
             (size_t)&local_558,0x458);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig5.super_CScriptBase._union + 0x10));
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  file_10.m_end = (iterator)0x459;
  file_10.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_578,
             msg_10);
  badsig5.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_EVAL_FALSE;
  badsig5.super_CScriptBase._union._8_8_ = 0;
  badsig5.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&badsig4,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_580 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig5,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_588,0x459);
  std::__cxx11::string::~string((string *)&badsig4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig5.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key4);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key2);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig4,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  file_11.m_end = (iterator)0x45e;
  file_11.m_begin = (iterator)&local_598;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5a8,
             msg_11);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig4,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  badsig6.super_CScriptBase._union.direct[0] = !bVar2;
  badsig6.super_CScriptBase._union._8_8_ = 0;
  badsig6.super_CScriptBase._union._16_8_ = 0;
  badsig5.super_CScriptBase._24_8_ = local_2e8;
  local_2e8._0_8_ =
       "!VerifyScript(badsig4, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_2e8._8_8_ = "";
  badsig5.super_CScriptBase._union._8_8_ =
       badsig5.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig5.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig5.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig6,(lazy_ostream *)&badsig5,1,0,WARN,_cVar6,
             (size_t)&local_5b8,0x45e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig6.super_CScriptBase._union + 0x10));
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  file_12.m_end = (iterator)0x45f;
  file_12.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5d8,
             msg_12);
  badsig6.super_CScriptBase._union.direct[0] = err == SCRIPT_ERR_EVAL_FALSE;
  badsig6.super_CScriptBase._union._8_8_ = 0;
  badsig6.super_CScriptBase._union._16_8_ = 0;
  ScriptErrorString_abi_cxx11_((string *)&badsig5,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5e0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&badsig6,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_5e8,0x45f);
  std::__cxx11::string::~string((string *)&badsig5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&badsig6.super_CScriptBase._union + 0x10));
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key1);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&keys,&key4);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig5,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  file_13.m_end = (iterator)0x464;
  file_13.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_608,
             msg_13);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig5,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  local_2e8._8_8_ = (element_type *)0x0;
  asStack_2d8[0].pi_ = (sp_counted_base *)0x0;
  badsig6.super_CScriptBase._24_8_ = &local_680;
  local_680._0_8_ =
       "!VerifyScript(badsig5, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_680.m_message.px = (element_type *)0xbcd7fb;
  badsig6.super_CScriptBase._union._8_8_ =
       badsig6.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  badsig6.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  badsig6.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_610 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_2e8[0] = (class_property<bool>)(class_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2e8,(lazy_ostream *)&badsig6,1,0,WARN,_cVar6,
             (size_t)&local_618,0x464);
  boost::detail::shared_count::~shared_count(asStack_2d8);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  file_14.m_end = (iterator)0x465;
  file_14.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_638,
             msg_14);
  local_2e8[0] = (class_property<bool>)(class_property<bool>)(err == SCRIPT_ERR_EVAL_FALSE);
  local_2e8._8_8_ = (element_type *)0x0;
  asStack_2d8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)&badsig6,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_640 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  pCStack_1b0 = (pointer)&badsig6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2e8,(lazy_ostream *)local_1c8,1,1,WARN,_cVar6,
             (size_t)&local_648,0x465);
  std::__cxx11::string::~string((string *)&badsig6);
  boost::detail::shared_count::~shared_count(asStack_2d8);
  std::vector<CKey,_std::allocator<CKey>_>::clear(&keys);
  CTransaction::CTransaction((CTransaction *)local_1c8,&txTo23);
  sign_multisig(&badsig6,&scriptPubKey23,&keys,(CTransaction *)local_1c8);
  CTransaction::~CTransaction((CTransaction *)local_1c8);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  file_15.m_end = (iterator)0x469;
  file_15.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_668,
             msg_15);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0113c5e0;
  local_1c8._16_8_ = (pointer)0x0;
  pCStack_1b0 = (pointer)(txFrom23.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue;
  local_1a8 = (pointer)0x0;
  local_1c8._8_8_ = (pointer)&txTo23;
  bVar2 = VerifyScript(&badsig6,&scriptPubKey23,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&err);
  local_680.m_message.px = (element_type *)0x0;
  local_680.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_2d8[1].pi_ = (sp_counted_base *)&local_690;
  local_690 = 
  "!VerifyScript(badsig6, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_688 = "";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_2e8._0_8_ = &PTR__lazy_ostream_0113a070;
  asStack_2d8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_698 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_680.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_680,(lazy_ostream *)local_2e8,1,0,WARN,_cVar6,(size_t)&local_6a0,0x469);
  boost::detail::shared_count::~shared_count(&local_680.m_message.pn);
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  file_16.m_end = (iterator)0x46a;
  file_16.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_6c0,
             msg_16);
  local_680.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(err == SCRIPT_ERR_INVALID_STACK_OPERATION)
  ;
  local_680.m_message.px = (element_type *)0x0;
  local_680.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_2e8,err);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01139e30;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  pCStack_1b0 = (pointer)local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_680,(lazy_ostream *)local_1c8,1,1,WARN,0xbcb770,(size_t)&stack0xfffffffffffff930
             ,0x46a);
  std::__cxx11::string::~string((string *)local_2e8);
  boost::detail::shared_count::~shared_count(&local_680.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig6.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig5.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig4.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig3.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&badsig1.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&goodsig3.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&goodsig2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&goodsig1.super_CScriptBase);
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&keys);
  CMutableTransaction::~CMutableTransaction(&txTo23);
  CTransaction::~CTransaction(&txFrom23);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey23.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key4.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key3.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key2.keydata);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key1.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG23)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();
    CKey key4 = GenerateRandomKey(/*compressed=*/false);

    CScript scriptPubKey23;
    scriptPubKey23 << OP_2 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << ToByteVector(key3.GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    const CTransaction txFrom23{BuildCreditingTransaction(scriptPubKey23)};
    CMutableTransaction txTo23 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom23);

    std::vector<CKey> keys;
    keys.push_back(key1); keys.push_back(key2);
    CScript goodsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key3);
    CScript goodsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key3);
    CScript goodsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key2); // Can't reuse sig
    CScript badsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key1); // sigs must be in correct order
    CScript badsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key3); keys.push_back(key2); // sigs must be in correct order
    CScript badsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key4); keys.push_back(key2); // sigs must match pubkeys
    CScript badsig4 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig4, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key4); // sigs must match pubkeys
    CScript badsig5 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig5, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear(); // Must have signatures
    CScript badsig6 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig6, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));
}